

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaTargetGenerator *this,cmNinjaVars *vars)

{
  cmGeneratorTarget *pcVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  string *psVar5;
  cmLocalNinjaGenerator *pcVar6;
  mapped_type *pmVar7;
  bool bVar8;
  allocator<char> local_1f9;
  key_type local_1f8;
  string local_1d8;
  string local_1b8;
  allocator<char> local_191;
  key_type local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  undefined1 local_f0 [8];
  string compilePdbPath;
  string pdbPath;
  string local_a8;
  byte local_83;
  byte local_82;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  cmMakefile *local_28;
  cmMakefile *mf;
  cmNinjaVars *vars_local;
  cmNinjaTargetGenerator *this_local;
  
  mf = (cmMakefile *)vars;
  vars_local = (cmNinjaVars *)this;
  pcVar3 = GetMakefile(this);
  local_28 = pcVar3;
  std::allocator<char>::allocator();
  local_82 = 0;
  local_83 = 0;
  pdbPath.field_2._M_local_buf[0xe] = '\0';
  pdbPath.field_2._M_local_buf[0xd] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"MSVC_C_ARCHITECTURE_ID",&local_49);
  pcVar4 = cmMakefile::GetDefinition(pcVar3,&local_48);
  pcVar3 = local_28;
  bVar8 = true;
  if (pcVar4 == (char *)0x0) {
    std::allocator<char>::allocator();
    local_82 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"MSVC_CXX_ARCHITECTURE_ID",&local_81);
    local_83 = 1;
    pcVar4 = cmMakefile::GetDefinition(pcVar3,&local_80);
    pcVar3 = local_28;
    bVar8 = true;
    if (pcVar4 == (char *)0x0) {
      std::allocator<char>::allocator();
      pdbPath.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"MSVC_CUDA_ARCHITECTURE_ID",
                 (allocator<char> *)(pdbPath.field_2._M_local_buf + 0xf));
      pdbPath.field_2._M_local_buf[0xd] = '\x01';
      pcVar4 = cmMakefile::GetDefinition(pcVar3,&local_a8);
      bVar8 = pcVar4 != (char *)0x0;
    }
  }
  if ((pdbPath.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((pdbPath.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(pdbPath.field_2._M_local_buf + 0xf));
  }
  if ((local_83 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((local_82 & 1) != 0) {
    std::allocator<char>::~allocator(&local_81);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar8) {
    std::__cxx11::string::string((string *)(compilePdbPath.field_2._M_local_buf + 8));
    cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
              ((string *)local_f0,&this->super_cmCommonTargetGenerator);
    TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((((TVar2 == EXECUTABLE) ||
         (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
         TVar2 == STATIC_LIBRARY)) ||
        (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
        TVar2 == SHARED_LIBRARY)) ||
       (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
       TVar2 == MODULE_LIBRARY)) {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBDirectory(&local_110,pcVar1,psVar5);
      std::__cxx11::string::operator=
                ((string *)(compilePdbPath.field_2._M_local_buf + 8),(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::operator+=((string *)(compilePdbPath.field_2._M_local_buf + 8),"/");
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBName(&local_130,pcVar1,psVar5);
      std::__cxx11::string::operator+=
                ((string *)(compilePdbPath.field_2._M_local_buf + 8),(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
    }
    pcVar6 = GetLocalGenerator(this);
    ConvertToNinjaPath(&local_170,this,(string *)((long)&compilePdbPath.field_2 + 8));
    cmOutputConverter::ConvertToOutputFormat
              (&local_150,
               &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_170,SHELL);
    pcVar3 = mf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"TARGET_PDB",&local_191)
    ;
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pcVar3,&local_190);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    pcVar6 = GetLocalGenerator(this);
    ConvertToNinjaPath(&local_1d8,this,(string *)local_f0);
    cmOutputConverter::ConvertToOutputFormat
              (&local_1b8,
               &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_1d8,SHELL);
    pcVar3 = mf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"TARGET_COMPILE_PDB",&local_1f9);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pcVar3,&local_1f8);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    EnsureParentDirectoryExists(this,(string *)((long)&compilePdbPath.field_2 + 8));
    EnsureParentDirectoryExists(this,(string *)local_f0);
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)(compilePdbPath.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaVars& vars) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CUDA_ARCHITECTURE_ID")) {
    std::string pdbPath;
    std::string compilePdbPath = this->ComputeTargetCompilePDB();
    if (this->GeneratorTarget->GetType() == cmStateEnums::EXECUTABLE ||
        this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
      pdbPath = this->GeneratorTarget->GetPDBDirectory(this->GetConfigName());
      pdbPath += "/";
      pdbPath += this->GeneratorTarget->GetPDBName(this->GetConfigName());
    }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
      ConvertToNinjaPath(pdbPath), cmOutputConverter::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        ConvertToNinjaPath(compilePdbPath), cmOutputConverter::SHELL);

    EnsureParentDirectoryExists(pdbPath);
    EnsureParentDirectoryExists(compilePdbPath);
    return true;
  }
  return false;
}